

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O3

void __thiscall
helics::Publication::publish
          (Publication *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *val)

{
  ValueFederate *pVVar1;
  string_view val_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> val_1;
  SmallBuffer buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  data_view local_b0;
  SmallBuffer local_90;
  
  ValueConverter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::convert(&local_90,val);
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  detail::convertFromBinary(local_90.heap,(string_view *)&local_d8);
  sVar3 = local_d8._M_string_length;
  _Var2._M_p = local_d8._M_dataplus._M_p;
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    val_00._M_str = (char *)local_d8._M_string_length;
    val_00._M_len = (size_t)local_d8._M_dataplus._M_p;
    bVar4 = changeDetected(&this->prevValue,val_00,this->delta);
    if (!bVar4) goto LAB_0021b991;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,sVar3,_Var2._M_p + sVar3);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    local_b0.dblock._M_len = local_90.bufferSize;
    local_b0.dblock._M_str = (char *)local_90.heap;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_b0);
    if (local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
LAB_0021b991:
  if (((local_90.usingAllocatedBuffer == true) && (local_90.nonOwning == false)) &&
     (local_90.heap != (byte *)0x0)) {
    operator_delete__(local_90.heap);
  }
  return;
}

Assistant:

void Publication::publish(const std::vector<std::string>& val)
{
    auto buffer = ValueConverter<std::vector<std::string>>::convert(val);
    auto str = ValueConverter<std::string_view>::interpret(buffer);
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, str, delta)) {
            prevValue = std::string(str);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        fed->publishBytes(*this, buffer);
    }
}